

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_event_handlers.h
# Opt level: O0

void __thiscall Am_Input_Event::~Am_Input_Event(Am_Input_Event *this)

{
  Am_Input_Event *this_local;
  
  Am_Value::~Am_Value(&this->user_id);
  return;
}

Assistant:

class _OA_DL_CLASSIMPORT Am_Input_Event
{
public:
  // MANIPULATORS
  void Set(Am_Input_Char ic, int new_x, int new_y, unsigned long time,
           Am_Drawonable *draw);

  // DATAMEMBERS
  //the char and modifier bits; see idefs.h
  Am_Input_Char input_char;

  // Drawonable this event happened in
  Am_Drawonable *draw;

  int x;
  int y;

  unsigned long time_stamp;

  // supports multiple users
  Am_Value user_id;
}